

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O2

int SSL_SESSION_to_bytes(SSL_SESSION *in,uint8_t **out_data,size_t *out_len)

{
  int iVar1;
  uint8_t *puVar2;
  uint uVar3;
  ScopedCBB cbb;
  
  if ((in->field_0x1b8 & 4) == 0) {
    CBB_zero(&cbb.ctx_);
    iVar1 = CBB_init(&cbb.ctx_,0x100);
    if (iVar1 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      iVar1 = bssl::SSL_SESSION_to_bytes_full(in,&cbb.ctx_,0);
      if (iVar1 != 0) {
        iVar1 = CBB_finish(&cbb.ctx_,out_data,out_len);
        uVar3 = (uint)(iVar1 != 0);
      }
    }
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
  }
  else {
    *out_len = 0xd;
    puVar2 = (uint8_t *)OPENSSL_memdup("NOT RESUMABLE",0xd);
    *out_data = puVar2;
    uVar3 = (uint)(puVar2 != (uint8_t *)0x0);
  }
  return uVar3;
}

Assistant:

int SSL_SESSION_to_bytes(const SSL_SESSION *in, uint8_t **out_data,
                         size_t *out_len) {
  if (in->not_resumable) {
    // If the caller has an unresumable session, e.g. if |SSL_get_session| were
    // called on a TLS 1.3 or False Started connection, serialize with a
    // placeholder value so it is not accidentally deserialized into a resumable
    // one.
    static const char kNotResumableSession[] = "NOT RESUMABLE";

    *out_len = strlen(kNotResumableSession);
    *out_data = (uint8_t *)OPENSSL_memdup(kNotResumableSession, *out_len);
    if (*out_data == NULL) {
      return 0;
    }

    return 1;
  }

  ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 256) ||
      !SSL_SESSION_to_bytes_full(in, cbb.get(), 0) ||
      !CBB_finish(cbb.get(), out_data, out_len)) {
    return 0;
  }

  return 1;
}